

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json11.cpp
# Opt level: O2

Json __thiscall json11::anon_unknown_21::JsonParser::fail(JsonParser *this,string *msg)

{
  string *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Json JVar1;
  __shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  Json::Json((Json *)&_Stack_28);
  if ((msg->field_2)._M_local_buf[8] == '\0') {
    std::__cxx11::string::operator=((string *)(msg->field_2)._M_allocated_capacity,in_RDX);
  }
  (msg->field_2)._M_local_buf[8] = '\x01';
  std::__shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2> *)this,&_Stack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  JVar1.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  JVar1.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Json)JVar1.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Json fail(string &&msg) {
        return fail(move(msg), Json());
    }